

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void def_symbol(c2m_ctx_t c2m_ctx,symbol_mode mode,node_t_conflict id,node_t_conflict scope,
               node_t_conflict def_node,node_code_t linkage)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  type *type2;
  node_t_conflict pnVar5;
  symbol_t el_00;
  symbol_t el_01;
  uint uVar6;
  int iVar7;
  int iVar8;
  node_t_conflict *ppnVar9;
  VARR_node_t *pVVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 in_register_00000034;
  node_t_conflict pnVar13;
  c2m_ctx_t type1;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  size_t sVar17;
  pos_t pVar18;
  symbol_t el;
  char *local_f0;
  ulong local_d8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  VARR_node_t *pVStack_b0;
  symbol_t local_78;
  node_t_conflict local_48;
  node_t_conflict pnStack_40;
  
  pnVar13 = (node_t_conflict)CONCAT44(in_register_00000034,mode);
  if (pnVar13->code == N_IGNORE) {
    return;
  }
  if ((id == (node_t_conflict)0x0) || (pnVar13->code != N_ID)) {
LAB_0018927f:
    __assert_fail("id->code == N_ID && scope != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1975,
                  "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                 );
  }
  uVar6 = id->code - N_FOR;
  if ((0x36 < uVar6) || ((0x40100300000081U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
    __assert_fail("scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1977,
                  "void def_symbol(c2m_ctx_t, enum symbol_mode, node_t, node_t, node_t, node_code_t)"
                 );
  }
  pvVar4 = scope->attr;
  iVar14 = (int)def_node;
  bVar2 = *(byte *)((long)pvVar4 + 0x28);
  iVar8 = *(int *)((long)pvVar4 + 0x38);
  type1 = *(c2m_ctx_t *)((long)pvVar4 + 0x40);
  bVar16 = bVar2 >> 5 & 1;
  if ((bVar2 & 6) == 0 && bVar16 != 0) {
    pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar13->uid);
    error(c2m_ctx,0x1c0239,pVar18.fname,pVar18._8_8_,(pnVar13->u).s.s);
  }
  local_d8 = local_d8 & 0xffffffff00000000;
  el_00.id = pnVar13;
  el_00._0_8_ = local_d8;
  el_00.scope = id;
  el_00.def_node = (node_t_conflict)uStack_c0;
  el_00.aux_node = (node_t_conflict)uStack_b8;
  el_00.defs = pVStack_b0;
  iVar7 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_00,HTAB_FIND,&local_78);
  if (iVar7 == 0) {
    symbol_insert(c2m_ctx,S_REGULAR,pnVar13,id,scope,(node_t_conflict)0x0);
    return;
  }
  if (scope->code != (local_78.def_node)->code &&
      ((local_78.def_node)->code == N_ENUM_CONST || scope->code == N_ENUM_CONST)) {
    pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar13->uid);
    error(c2m_ctx,0x1c025d,pVar18.fname,pVar18._8_8_,(pnVar13->u).s.s);
    return;
  }
  type2 = *(type **)((long)(local_78.def_node)->attr + 0x40);
  bVar3 = *(byte *)((long)(local_78.def_node)->attr + 0x28);
  local_48 = local_78.def_node;
  pnStack_40 = local_78.aux_node;
  if (iVar14 == 0) {
    local_f0 = "repeated declaration %s";
    if ((((bVar2 & 1) == 0) || ((bVar3 & 1) == 0)) ||
       (iVar7 = type_eq_p((type *)type1,type2), iVar7 == 0)) goto LAB_0018903b;
  }
  else {
    iVar7 = compatible_types_p((type *)type1,type2,0);
    if (iVar7 == 0) {
      local_f0 = "incompatible types of %s declarations";
LAB_0018903b:
      pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar13->uid)
      ;
      type1 = c2m_ctx;
      error(c2m_ctx,local_f0,pVar18.fname,pVar18._8_8_,(pnVar13->u).s.s);
    }
  }
  if ((bVar3 >> 5 & 1) != bVar16) {
    pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar13->uid);
    type1 = c2m_ctx;
    error(c2m_ctx,0x1c02c7,pVar18.fname,pVar18._8_8_,(pnVar13->u).s.s);
  }
  if ((iVar14 == 0x59 && iVar8 == 0x58) || (iVar14 == 0x58 && iVar8 == 0x59)) {
    pVar18 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)pnVar13->uid);
    type1 = c2m_ctx;
    warning(c2m_ctx,0x1c02fc,pVar18.fname,pVar18._8_8_,(pnVar13->u).s.s);
  }
  ppnVar9 = (local_78.defs)->varr;
  if (ppnVar9 != (node_t_conflict *)0x0) {
    sVar17 = (local_78.defs)->els_num;
    uVar11 = sVar17 + 1;
    if ((local_78.defs)->size < uVar11) {
      sVar17 = (uVar11 >> 1) + uVar11;
      ppnVar9 = (node_t_conflict *)realloc(ppnVar9,sVar17 * 8);
      (local_78.defs)->varr = ppnVar9;
      (local_78.defs)->size = sVar17;
      sVar17 = (local_78.defs)->els_num;
      uVar11 = sVar17 + 1;
    }
    (local_78.defs)->els_num = uVar11;
    ppnVar9[sVar17] = scope;
    iVar8 = incomplete_type_p(c2m_ctx,type2);
    pnVar13 = pnStack_40;
    if (iVar8 != 0) {
      type1 = (c2m_ctx_t)&DAT_00000018;
      pVVar10 = (VARR_node_t *)malloc(0x18);
      if (pVVar10 == (VARR_node_t *)0x0) goto LAB_001892a3;
      pVVar10->els_num = 0;
      pVVar10->size = 4;
      ppnVar9 = (node_t_conflict *)malloc(0x20);
      sVar17 = 4;
      pVVar10->varr = ppnVar9;
      uVar11 = 0;
      uVar15 = 0;
      do {
        if ((local_78.defs)->els_num <= uVar15) goto LAB_00189226;
        if ((local_78.defs)->varr == (node_t_conflict *)0x0) {
          def_symbol_cold_3();
LAB_0018927a:
          def_symbol_cold_2();
          goto LAB_0018927f;
        }
        if (ppnVar9 == (node_t_conflict *)0x0) goto LAB_0018927a;
        pnVar5 = (local_78.defs)->varr[uVar15];
        uVar1 = uVar11 + 1;
        uVar12 = uVar11;
        uVar11 = uVar1;
        if (sVar17 < uVar1) {
          sVar17 = (uVar1 >> 1) + uVar1;
          ppnVar9 = (node_t_conflict *)realloc(ppnVar9,sVar17 * 8);
          pVVar10->varr = ppnVar9;
          pVVar10->size = sVar17;
          uVar12 = pVVar10->els_num;
          uVar11 = uVar12 + 1;
        }
        ppnVar9[uVar12] = pnVar5;
        uVar15 = uVar15 + 1;
        pVVar10->els_num = uVar11;
      } while (local_78.defs != (VARR_node_t *)0x0);
      def_symbol_cold_1();
LAB_00189226:
      el_01.id = local_78.id;
      el_01.mode = local_78.mode;
      el_01._4_4_ = local_78._4_4_;
      el_01.scope = local_78.scope;
      el_01.def_node = scope;
      el_01.aux_node = pnVar13;
      el_01.defs = pVVar10;
      HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_01,HTAB_REPLACE,&local_78);
    }
    return;
  }
  def_symbol_cold_4();
LAB_001892a3:
  mir_varr_error((char *)type1);
}

Assistant:

static void def_symbol (c2m_ctx_t c2m_ctx, enum symbol_mode mode, node_t id, node_t scope,
                        node_t def_node, node_code_t linkage) {
  symbol_t sym;
  struct decl_spec tab_decl_spec, decl_spec;

  if (id->code == N_IGNORE) return;
  assert (id->code == N_ID && scope != NULL);
  assert (scope->code == N_MODULE || scope->code == N_BLOCK || scope->code == N_STRUCT
          || scope->code == N_UNION || scope->code == N_FUNC || scope->code == N_FOR);
  decl_spec = ((decl_t) def_node->attr)->decl_spec;
  if (decl_spec.thread_local_p && !decl_spec.static_p && !decl_spec.extern_p)
    error (c2m_ctx, POS (id), "auto %s is declared as thread local", id->u.s.s);
  if (!symbol_find (c2m_ctx, mode, id, scope, &sym)) {
    symbol_insert (c2m_ctx, mode, id, scope, def_node, NULL);
    return;
  }
  tab_decl_spec = ((decl_t) sym.def_node->attr)->decl_spec;
  if ((def_node->code == N_ENUM_CONST || sym.def_node->code == N_ENUM_CONST)
      && def_node->code != sym.def_node->code) {
    error (c2m_ctx, POS (id), "%s redeclared as a different kind of symbol", id->u.s.s);
    return;
  } else if (linkage == N_IGNORE) {
    if (!decl_spec.typedef_p || !tab_decl_spec.typedef_p
        || !type_eq_p (decl_spec.type, tab_decl_spec.type))
#if defined(__APPLE__)
      /* a hack to use our definition instead of macosx for non-GNU compiler */
      if (strcmp (id->u.s.s, "__darwin_va_list") != 0)
#endif
        error (c2m_ctx, POS (id), "repeated declaration %s", id->u.s.s);
  } else if (!compatible_types_p (decl_spec.type, tab_decl_spec.type, FALSE)) {
    error (c2m_ctx, POS (id), "incompatible types of %s declarations", id->u.s.s);
  }
  if (tab_decl_spec.thread_local_p != decl_spec.thread_local_p) {
    error (c2m_ctx, POS (id), "thread local and non-thread local declarations of %s", id->u.s.s);
  }
  if ((decl_spec.linkage == N_EXTERN && linkage == N_STATIC)
      || (decl_spec.linkage == N_STATIC && linkage == N_EXTERN))
    warning (c2m_ctx, POS (id), "%s defined with external and internal linkage", id->u.s.s);
  VARR_PUSH (node_t, sym.defs, def_node);
  if (incomplete_type_p (c2m_ctx, tab_decl_spec.type)) symbol_def_replace (c2m_ctx, sym, def_node);
}